

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs,x86Op xv)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  IRIns *pIVar5;
  Reg rr;
  Reg rb;
  MCode *pMVar6;
  MCode MVar7;
  byte bVar9;
  uint uVar8;
  x86Op xo;
  uint uVar10;
  ulong uVar11;
  MCode MVar12;
  uint uVar13;
  Reg RVar14;
  bool bVar15;
  
  uVar2 = (ir->field_0).op2;
  uVar11 = (ulong)uVar2;
  pIVar5 = as->ir;
  cVar1 = (char)xs;
  if ((short)uVar2 < 0) {
    if ((xv != XOg_FADDq) && ((as->flags & 0x40) != 0)) {
      rr = ra_dest(as,ir,0xffef);
      cVar1 = *(char *)((long)as->ir + uVar11 * 8 + 6);
      RVar14 = (Reg)cVar1;
      if (cVar1 < '\0') {
        RVar14 = ra_allocref(as,(uint)uVar2,0xffef);
      }
      bVar9 = (byte)RVar14 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      uVar10._0_2_ = *(IROpT *)((long)ir + 4);
      uVar10._2_2_ = *(IRRef1 *)((long)ir + 6);
      rb = asm_fuseloadm(as,(uint)(ir->field_0).op1,~(1 << (RVar14 & 0x1f)) & 0xffef,
                         (uint)((0x604208U >> (uVar10 & 0x1f) & 1) != 0));
      xo = RVar14 << 0x13 ^ (0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1) * 0x800000 + xv;
LAB_0014a921:
      emit_mrm(as,xo,rr,rb);
      return;
    }
    rr = ra_dest(as,ir,0xffed);
    if (rr == 1) {
      rr = ra_scratch(as,0xffed);
      uVar8._0_2_ = *(IROpT *)((long)ir + 4);
      uVar8._2_2_ = *(IRRef1 *)((long)ir + 6);
      bVar15 = (0x604208U >> (uVar8 & 0x1f) & 1) == 0;
      bVar9 = 8;
      if (bVar15) {
        bVar9 = 0;
      }
      pMVar6 = as->mcp;
      pMVar6[-1] = (byte)rr & 7 | 200;
      pMVar6[-2] = 0x8b;
      uVar8 = rr >> 3 & 1;
      if (bVar15 && uVar8 == 0) {
        pMVar6 = pMVar6 + -2;
      }
      else {
        pMVar6[-3] = bVar9 | (byte)uVar8 | 0x40;
        pMVar6 = pMVar6 + -3;
      }
      as->mcp = pMVar6;
    }
    bVar9 = *(byte *)((long)pIVar5 + uVar11 * 8 + 6);
    if ((char)bVar9 < '\0') {
      uVar8 = ra_allocref(as,(uint)uVar2,2);
    }
    else {
      uVar8 = 1;
      if (bVar9 != 1) {
        ra_scratch(as,2);
        uVar8 = (uint)bVar9;
      }
    }
    uVar13._0_2_ = *(IROpT *)((long)ir + 4);
    uVar13._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar13 = (-(uint)((0x604208U >> (uVar13 & 0x1f) & 1) != 0) & 0x80200) + xs;
    pMVar6 = as->mcp;
    pMVar6[-1] = ((byte)rr & 7) + cVar1 * '\b' | 0xc0;
    pMVar6[-2] = 0xd3;
    uVar10 = rr >> 3 & 1 | uVar13 >> 1 & 0x104;
    if (uVar10 == 0) {
      pMVar6 = pMVar6 + -2;
    }
    else {
      pMVar6[-3] = (byte)uVar10 | (byte)(uVar13 >> 0x10) | 0x40;
      pMVar6 = pMVar6 + -3;
    }
    as->mcp = pMVar6;
    bVar9 = (byte)uVar8 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
    if (uVar8 == 1) goto LAB_0014aa27;
    pMVar6[-1] = (byte)uVar8 & 7 | 200;
    pMVar6[-2] = 0x8b;
    if ((uVar8 & 8) == 0) goto LAB_0014aa1c;
    pMVar6[-3] = 'A';
LAB_0014a8d6:
    pMVar6 = pMVar6 + -3;
  }
  else {
    rr = ra_dest(as,ir,0xffef);
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar8 = (uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0);
    uVar13 = (uVar8 << 5 | 0x1f) & pIVar5[uVar11].field_1.op12;
    MVar12 = (MCode)uVar13;
    if (((xv == XOg_FADDq) && (uVar13 != 0)) && ((as->flags & 0x40) != 0)) {
      rb = asm_fuseloadm(as,(uint)(ir->field_0).op1,0xffef,uVar8);
      if (rb != rr) {
        MVar7 = -MVar12;
        if (xs != XOg_ROL) {
          MVar7 = MVar12;
        }
        pMVar6 = as->mcp;
        as->mcp = pMVar6 + -1;
        pMVar6[-1] = MVar7;
        xo = (0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1) << 0x17 | XV_RORX;
        goto LAB_0014a921;
      }
    }
    if (uVar13 == 0) goto LAB_0014aa27;
    if (uVar13 == 1) {
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      pMVar6 = as->mcp;
      pMVar6[-1] = ((byte)rr & 7) + cVar1 * '\b' | 0xc0;
      pMVar6[-2] = 0xd1;
    }
    else {
      pMVar6 = as->mcp;
      as->mcp = pMVar6 + -1;
      pMVar6[-1] = MVar12;
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      pMVar6 = as->mcp;
      pMVar6[-1] = ((byte)rr & 7) + cVar1 * '\b' | 0xc0;
      pMVar6[-2] = 0xc1;
    }
    uVar8 = (-(uint)((0x604208U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200) + xs;
    uVar13 = rr >> 3 & 1 | uVar8 >> 1 & 0x104;
    if (uVar13 != 0) {
      pMVar6[-3] = (byte)uVar13 | (byte)(uVar8 >> 0x10) | 0x40;
      goto LAB_0014a8d6;
    }
LAB_0014aa1c:
    pMVar6 = pMVar6 + -2;
  }
  as->mcp = pMVar6;
LAB_0014aa27:
  ra_left(as,rr,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs, x86Op xv)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    if (!xv && shift && (as->flags & JIT_F_BMI2)) {
      Reg left = asm_fuseloadm(as, ir->op1, RSET_GPR, irt_is64(ir->t));
      if (left != dest) {  /* BMI2 rotate right by constant. */
	emit_i8(as, xs == XOg_ROL ? -shift : shift);
	emit_mrm(as, VEX_64IR(ir, XV_RORX), dest, left);
	return;
      }
    }
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else if ((as->flags & JIT_F_BMI2) && xv) {	/* BMI2 variable shifts. */
    Reg left, right;
    dest = ra_dest(as, ir, RSET_GPR);
    right = ra_alloc1(as, rref, RSET_GPR);
    left = asm_fuseloadm(as, ir->op1, rset_exclude(RSET_GPR, right),
			 irt_is64(ir->t));
    emit_mrm(as, VEX_64IR(ir, xv) ^ (right << 19), dest, left);
    return;
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, REX_64IR(ir, RID_ECX), dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}